

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  j_compress_ptr in_RSI;
  long in_RDI;
  int blkn;
  int Al;
  uchar *st;
  arith_entropy_ptr entropy;
  undefined4 local_28;
  long lVar1;
  
  lVar1 = *(long *)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(lVar1 + 0x60) == 0) {
      emit_restart(in_RSI,(int)((ulong)lVar1 >> 0x20));
      *(undefined4 *)(lVar1 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(lVar1 + 100) = *(int *)(lVar1 + 100) + 1;
      *(uint *)(lVar1 + 100) = *(uint *)(lVar1 + 100) & 7;
    }
    *(int *)(lVar1 + 0x60) = *(int *)(lVar1 + 0x60) + -1;
  }
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x170); local_28 = local_28 + 1) {
    arith_encode((j_compress_ptr)entropy,st,Al);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp;
  int blkn;
  int Al = cinfo->Al;
  JBLOCKROW block;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];

    /* We simply emit the Al'th bit of the DC coefficient value. */
    temp = (*block)[0];
    emit_bits(entropy, (unsigned int)(temp >> Al), 1);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}